

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_number_decimal(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined8 extraout_RAX;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long *unaff_RBX;
  char *pcVar9;
  undefined **ppuVar10;
  char *unaff_R15;
  bson_decimal128_t decimal128;
  bson_iter_t iter;
  bson_t b;
  bson_error_t error;
  undefined4 uStack_adc;
  undefined8 uStack_ad8;
  undefined2 uStack_ad0;
  int iStack_ac8;
  int iStack_ac4;
  char acStack_ac0 [504];
  code *pcStack_8c8;
  undefined1 auStack_8b8 [512];
  char *pcStack_6b8;
  code *pcStack_6b0;
  int iStack_6a0;
  int iStack_69c;
  char acStack_698 [504];
  long *plStack_4a0;
  long local_410;
  long local_408;
  undefined1 local_400 [128];
  undefined1 local_380 [232];
  undefined1 local_298 [648];
  
  cVar1 = bson_init_from_json(local_380,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,local_298);
  if (cVar1 == '\0') goto LAB_00133315;
  cVar1 = bson_iter_init(local_400,local_380);
  if (cVar1 == '\0') {
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    test_bson_json_number_decimal_cold_5();
  }
  else {
    cVar1 = bson_iter_find(local_400,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    iVar2 = bson_iter_type(local_400);
    if (iVar2 != 0x13) goto LAB_00133306;
    unaff_RBX = &local_410;
    bson_iter_decimal128(local_400,unaff_RBX);
    if (local_410 != 0xb) goto LAB_0013330b;
    if (local_408 == 0x3040000000000000) {
      bson_destroy(local_380);
      return;
    }
  }
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  test_bson_json_number_decimal_cold_1();
  pcVar9 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar10 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_4a0 = unaff_RBX;
  do {
    pcStack_6b0 = (code *)0x133357;
    lVar3 = bson_new_from_json(pcVar9,0xffffffffffffffff,&iStack_6a0);
    if (lVar3 != 0) {
      pcStack_6b0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_6b0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_698,
              unaff_R15);
      pcStack_6b0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_6a0 != 1) {
LAB_001333cc:
      pcStack_6b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_8c8 = (code *)0x1333f1;
      pcStack_6b8 = acStack_698;
      pcStack_6b0 = (code *)&iStack_6a0;
      pcVar9 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_8b8);
      pcStack_8c8 = (code *)0x1333fe;
      pcVar4 = (char *)bson_as_json(pcVar9,0);
      if (pcVar4 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_8c8 = (code *)0x133428;
        bson_free(pcVar4);
        pcStack_8c8 = (code *)0x133430;
        bson_destroy(pcVar9);
        return;
      }
      pcStack_8c8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar4,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_8c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_ad8 = 0x2200223a2261227b;
      uStack_ad0 = 0x7d;
      uStack_adc = 0x227b;
      pcStack_8c8 = (code *)pcVar9;
      lVar3 = bson_new_from_json(&uStack_ad8,9,&iStack_ac8);
      if (lVar3 == 0) {
        if (iStack_ac8 != 1) goto LAB_001334fc;
        if (iStack_ac4 != 1) goto LAB_00133501;
        pcVar9 = acStack_ac0;
        pcVar4 = strstr(pcVar9,"Got parse error");
        if (pcVar4 == (char *)0x0) goto LAB_00133506;
        lVar3 = bson_new_from_json(&uStack_adc,3,&iStack_ac8);
        if (lVar3 != 0) goto LAB_001334f7;
        if (iStack_ac8 != 1) goto LAB_0013350e;
        if (iStack_ac4 == 1) {
          pcVar4 = strstr(pcVar9,"Got parse error");
          if (pcVar4 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar6 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar5 = bson_bcon_magic();
      uVar6 = bcon_new(0,"a",uVar5,0xf,1,0,uVar6,pcVar9,ppuVar10);
      uVar7 = bcon_new(0,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar6,uVar7,0);
      uVar6 = bson_new();
      uVar7 = bson_new();
      uVar8 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar6,uVar7,uVar8,0);
      uVar6 = bcon_new(0,"a",uVar5,0xf,1,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar6,0);
      uVar6 = bson_new();
      _test_json_produces_multiple("[]",0,uVar6,0);
      uVar6 = bcon_new(0,"0","{","x",uVar5,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar6,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_69c != 2) {
      pcStack_6b0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    unaff_R15 = ppuVar10[-1];
    pcStack_6b0 = (code *)0x13337e;
    pcVar9 = strstr(acStack_698,unaff_R15);
    if (pcVar9 == (char *)0x0) goto LAB_001333a4;
    pcVar9 = *ppuVar10;
    ppuVar10 = ppuVar10 + 2;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_bson_json_number_decimal (void)
{
   bson_error_t error;
   bson_iter_t iter;
   bson_decimal128_t decimal128;
   const char *json = "{ \"key\" : { \"$numberDecimal\": \"11\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_decimal128 (&iter, &decimal128);
   BSON_ASSERT (decimal128.low == 11);
   BSON_ASSERT (decimal128.high == 0x3040000000000000ULL);
   bson_destroy (&b);
}